

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_reinitialize_test.cpp
# Opt level: O0

void __thiscall
metacall_reinitialize_test_DefaultConstructor_Test::TestBody
          (metacall_reinitialize_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_1;
  size_t iterator;
  AssertionResult gtest_ar;
  size_t initialize_count;
  metacall_log_stdio_type log_stdio;
  int *in_stack_ffffffffffffff50;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  char *in_stack_ffffffffffffff60;
  AssertionResult *this_01;
  AssertHelper local_88;
  Message local_80;
  undefined4 local_78;
  undefined4 local_74;
  AssertionResult local_70;
  ulong local_60;
  uint local_54;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_30;
  undefined4 local_2c;
  AssertionResult local_28;
  undefined8 local_18;
  undefined8 local_10 [2];
  
  metacall_print_info();
  local_10[0] = _stdout;
  local_18 = 10;
  local_2c = 0;
  local_30 = metacall_log(0,local_10);
  this_01 = &local_28;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_ffffffffffffff60,
             (int *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message(local_48);
    in_stack_ffffffffffffff60 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10aa11);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_reinitialize_test/source/metacall_reinitialize_test.cpp"
               ,0x2f,in_stack_ffffffffffffff60);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x10aa5f);
  }
  local_54 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10aabb);
  if (local_54 == 0) {
    for (local_60 = 0; local_60 < 10; local_60 = local_60 + 1) {
      local_74 = 0;
      local_78 = metacall_initialize();
      this_00 = &local_70;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (&this_01->success_,in_stack_ffffffffffffff60,
                 (int *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),(int *)this_00
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
      in_stack_ffffffffffffff5f = bVar1;
      if (!bVar1) {
        testing::Message::Message(&local_80);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x10ab74);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_reinitialize_test/source/metacall_reinitialize_test.cpp"
                   ,0x33,message);
        testing::internal::AssertHelper::operator=(&local_88,&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        testing::Message::~Message((Message *)0x10abc0);
      }
      local_54 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ac16);
      if (local_54 != 0) {
        return;
      }
      metacall_destroy();
    }
  }
  return;
}

Assistant:

TEST_F(metacall_reinitialize_test, DefaultConstructor)
{
	metacall_print_info();

	metacall_log_stdio_type log_stdio = { stdout };

	const size_t initialize_count = 10;

	ASSERT_EQ((int)0, (int)metacall_log(METACALL_LOG_STDIO, (void *)&log_stdio));

	for (size_t iterator = 0; iterator < initialize_count; ++iterator)
	{
		ASSERT_EQ((int)0, (int)metacall_initialize());

/* Mock */
#if defined(OPTION_BUILD_LOADERS_MOCK)
		{
			const char *mock_scripts[] = {
				"empty.mock"
			};

			EXPECT_EQ((int)0, (int)metacall_load_from_file("mock", mock_scripts, sizeof(mock_scripts) / sizeof(mock_scripts[0]), NULL));
		}
#endif /* OPTION_BUILD_LOADERS_MOCK */

		metacall_destroy();
	}
}